

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_decoding_transform.h
# Opt level: O0

bool __thiscall
draco::PredictionSchemeNormalOctahedronDecodingTransform<int>::DecodeTransformData
          (PredictionSchemeNormalOctahedronDecodingTransform<int> *this,DecoderBuffer *buffer)

{
  bool bVar1;
  uint16_t uVar2;
  DecoderBuffer *in_RSI;
  int center_value;
  int max_quantized_value;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  bool local_1;
  
  bVar1 = DecoderBuffer::Decode<int>
                    (in_RSI,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (bVar1) {
    uVar2 = DecoderBuffer::bitstream_version(in_RSI);
    if ((0x201 < uVar2) ||
       (bVar1 = DecoderBuffer::Decode<int>
                          (in_RSI,(int *)CONCAT44(in_stack_ffffffffffffffe4,
                                                  in_stack_ffffffffffffffe0)), bVar1)) {
      local_1 = PredictionSchemeNormalOctahedronTransformBase<int>::set_max_quantized_value
                          ((PredictionSchemeNormalOctahedronTransformBase<int> *)in_RSI,
                           in_stack_ffffffffffffffe4);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DecodeTransformData(DecoderBuffer *buffer) {
    DataTypeT max_quantized_value, center_value;
    if (!buffer->Decode(&max_quantized_value)) {
      return false;
    }
    if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
      if (!buffer->Decode(&center_value)) {
        return false;
      }
    }
    (void)center_value;
    return this->set_max_quantized_value(max_quantized_value);
  }